

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::jsonToHeap
          (Interpreter *this,unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *v
          ,bool *filled,Value *attach)

{
  JsonnetJsonValue *pJVar1;
  HeapEntity *pHVar2;
  _func_int *p_Var3;
  Allocator *this_00;
  HeapThunk *pHVar4;
  mapped_type *ppHVar5;
  _Base_ptr p_Var6;
  anon_union_8_3_4e909c26_for_v aVar7;
  pointer args_2;
  Value *attach_00;
  _Link_type __x;
  void **in_R8;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *args_3;
  pointer puVar8;
  Value VVar9;
  undefined1 local_d8 [40];
  HeapEntity *local_b0;
  _Base_ptr local_a8;
  Identifier *local_a0;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  local_98;
  undefined1 local_68 [40];
  uchar local_40 [16];
  
  pJVar1 = (v->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
           ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
           super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl;
  switch(pJVar1->kind) {
  case ARRAY:
    local_d8._0_8_ = (HeapThunk *)0x0;
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = 0;
    VVar9 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            *)local_d8);
    attach->t = ARRAY;
    attach->v = VVar9._0_8_;
    pJVar1 = (v->_M_t).
             super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>._M_t.
             super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
             super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl;
    args_2 = *(pointer *)
              ((long)&(pJVar1->elements).
                      super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
              + 8);
    puVar8 = *(pointer *)
              &(pJVar1->elements).
               super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
               ._M_impl;
    *filled = true;
    if (args_2 == puVar8) {
      return;
    }
    pHVar2 = (attach->v).h;
    puVar8 = (pointer)0x0;
    do {
      local_d8._0_8_ =
           (anonymous_namespace)::Interpreter::
           makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                     ((Interpreter *)this,(Identifier **)this->idArrayElement,(void **)0x0,
                      (int *)args_2,in_R8);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)(pHVar2 + 1),(value_type *)local_d8);
      p_Var3 = pHVar2[1]._vptr_HeapEntity[(long)puVar8];
      jsonToHeap(this,(unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                      ((long)puVar8 * 8 +
                      *(long *)&(((v->_M_t).
                                  super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>
                                  .super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl)->
                                elements).
                                super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                                ._M_impl),(bool *)(p_Var3 + 10),(Value *)(p_Var3 + 0x10));
      puVar8 = (pointer)((long)&(puVar8->_M_t).
                                super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
                        + 1);
      pJVar1 = (v->_M_t).
               super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>._M_t.
               super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
               super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl;
      args_2 = (pointer)((long)*(pointer *)
                                ((long)&(pJVar1->elements).
                                        super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                                + 8) -
                         *(long *)&(pJVar1->elements).
                                   super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                                   ._M_impl >> 3);
    } while (puVar8 < args_2);
    return;
  case BOOL:
    aVar7._0_4_ = -(uint)(pJVar1->number != 0.0) & 1;
    aVar7._4_4_ = 0;
    attach->t = BOOLEAN;
    goto LAB_0017b49f;
  case NULL_KIND:
    attach->t = NULL_TYPE;
    break;
  case NUMBER:
    aVar7 = (anon_union_8_3_4e909c26_for_v)pJVar1->number;
    attach->t = NUMBER;
LAB_0017b49f:
    attach->v = aVar7;
    break;
  case OBJECT:
    local_68._24_8_ = local_68 + 8;
    local_68._0_8_ = 0;
    local_68._8_8_ = (_Base_ptr)0x0;
    local_68._16_8_ = (_Base_ptr)0x0;
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    attach_00 = (Value *)this->idJsonObjVar;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_t._M_impl._0_8_ = 0;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __x = (_Link_type)local_68;
    args_3 = &local_98;
    local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68._32_8_ = local_68._24_8_;
    VVar9 = (anonymous_namespace)::Interpreter::
            makeObject<jsonnet::internal::(anonymous_namespace)::HeapComprehensionObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,jsonnet::internal::AST_const*,jsonnet::internal::Identifier_const*,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>>
                      ((Interpreter *)this,
                       (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)__x,this->jsonObjVar,(Identifier *)attach_00,args_3);
    attach->t = OBJECT;
    attach->v = VVar9._0_8_;
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                *)local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
    std::
    _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                *)local_68._16_8_,__x);
    *filled = true;
    pJVar1 = (v->_M_t).
             super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>._M_t.
             super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
             super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl;
    p_Var6 = *(_Base_ptr *)((long)&(pJVar1->fields)._M_t + 0x18);
    local_a8 = (_Base_ptr)((long)&(pJVar1->fields)._M_t + 8);
    if (p_Var6 == local_a8) {
      return;
    }
    local_b0 = (attach->v).h + 5;
    do {
      pHVar4 = (anonymous_namespace)::Interpreter::
               makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                         ((Interpreter *)this,(Identifier **)this->idJsonObjVar,(void **)0x0,
                          (int *)attach_00,(void **)args_3);
      this_00 = this->alloc;
      decode_utf8((UString *)local_d8,(string *)(p_Var6 + 1));
      local_a0 = Allocator::makeIdentifier(this_00,(UString *)local_d8);
      ppHVar5 = std::
                map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                              *)local_b0,&local_a0);
      *ppHVar5 = pHVar4;
      if ((UString *)local_d8._0_8_ != (UString *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ * 4 + 4);
      }
      attach_00 = &pHVar4->content;
      jsonToHeap(this,(unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                      (p_Var6 + 2),(bool *)&(pHVar4->super_HeapEntity).field_0xa,attach_00);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_a8);
    return;
  case STRING:
    decode_utf8((UString *)local_d8,&pJVar1->string);
    VVar9 = makeString(this,(UString *)local_d8._0_8_);
    attach->t = STRING;
    attach->v = VVar9._0_8_;
    if ((UString *)local_d8._0_8_ != (UString *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ * 4 + 4);
    }
    break;
  default:
    goto switchD_0017b276_default;
  }
  *filled = true;
switchD_0017b276_default:
  return;
}

Assistant:

void jsonToHeap(const std::unique_ptr<JsonnetJsonValue> &v, bool &filled, Value &attach)
    {
        // In order to not anger the garbage collector, assign to attach immediately after
        // making the heap object.
        switch (v->kind) {
            case JsonnetJsonValue::STRING:
                attach = makeString(decode_utf8(v->string));
                filled = true;
                break;

            case JsonnetJsonValue::BOOL:
                attach = makeBoolean(v->number != 0.0);
                filled = true;
                break;

            case JsonnetJsonValue::NUMBER:
                attach = makeNumber(v->number);
                filled = true;
                break;

            case JsonnetJsonValue::NULL_KIND:
                attach = makeNull();
                filled = true;
                break;

            case JsonnetJsonValue::ARRAY: {
                attach = makeArray(std::vector<HeapThunk *>{});
                filled = true;
                auto *arr = static_cast<HeapArray *>(attach.v.h);
                for (size_t i = 0; i < v->elements.size(); ++i) {
                    arr->elements.push_back(
                        makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr));
                    jsonToHeap(v->elements[i], arr->elements[i]->filled, arr->elements[i]->content);
                }
            } break;

            case JsonnetJsonValue::OBJECT: {
                attach = makeObject<HeapComprehensionObject>(
                    BindingFrame{}, jsonObjVar, idJsonObjVar, BindingFrame{});
                filled = true;
                auto *obj = static_cast<HeapComprehensionObject *>(attach.v.h);
                for (const auto &pair : v->fields) {
                    auto *thunk = makeHeap<HeapThunk>(idJsonObjVar, nullptr, 0, nullptr);
                    obj->compValues[alloc->makeIdentifier(decode_utf8(pair.first))] = thunk;
                    jsonToHeap(pair.second, thunk->filled, thunk->content);
                }
            } break;
        }
    }